

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Select * __thiscall
wasm::Builder::makeSelect
          (Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse)

{
  Select *this_00;
  
  this_00 = MixedArena::alloc<wasm::Select>(&this->wasm->allocator);
  this_00->condition = condition;
  this_00->ifTrue = ifTrue;
  this_00->ifFalse = ifFalse;
  Select::finalize(this_00);
  return this_00;
}

Assistant:

Select*
  makeSelect(Expression* condition, Expression* ifTrue, Expression* ifFalse) {
    auto* ret = wasm.allocator.alloc<Select>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize();
    return ret;
  }